

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractEuler.cpp
# Opt level: O0

void anon_unknown.dwarf_4210c::testMatrix
               (M44f *M,_func_M44f_M44f_ptr_Order *matrixEulerMatrix,Order order)

{
  ostream *poVar1;
  float *pfVar2;
  void *pvVar3;
  code *in_RSI;
  Matrix44<float> *this;
  float extraout_XMM0_Da;
  int k;
  int j;
  M44f D;
  M44f N;
  int local_9c;
  int local_98;
  Matrix44<float> *in_stack_ffffffffffffff90;
  Matrix44<float> *in_stack_ffffffffffffff98;
  undefined1 local_54 [84];
  
  (*in_RSI)(local_54);
  Imath_3_2::Matrix44<float>::operator-(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  local_98 = 0;
  do {
    if (2 < local_98) {
      return;
    }
    for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
      this = (Matrix44<float> *)&stack0xffffffffffffff6c;
      Imath_3_2::Matrix44<float>::operator[](this,local_98);
      std::abs((int)this);
      if (2e-06 < extraout_XMM0_Da) {
        poVar1 = std::operator<<((ostream *)&std::cout,
                                 "unexpectedly large matrix to euler angles conversion error: ");
        pfVar2 = Imath_3_2::Matrix44<float>::operator[]
                           ((Matrix44<float> *)&stack0xffffffffffffff6c,local_98);
        pvVar3 = (void *)std::ostream::operator<<(poVar1,pfVar2[local_9c]);
        std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
        poVar1 = (ostream *)std::ostream::operator<<(&std::cout,local_98);
        poVar1 = std::operator<<(poVar1," ");
        pvVar3 = (void *)std::ostream::operator<<(poVar1,local_9c);
        std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
        std::operator<<((ostream *)&std::cout,"M\n");
        poVar1 = Imath_3_2::operator<<((ostream *)N.x._44_8_,(Matrix44<float> *)N.x[2]._4_8_);
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        std::operator<<((ostream *)&std::cout,"N\n");
        poVar1 = Imath_3_2::operator<<((ostream *)N.x._44_8_,(Matrix44<float> *)N.x[2]._4_8_);
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        std::operator<<((ostream *)&std::cout,"D\n");
        poVar1 = Imath_3_2::operator<<((ostream *)N.x._44_8_,(Matrix44<float> *)N.x[2]._4_8_);
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testExtractEuler.cpp"
                      ,0x57,
                      "void (anonymous namespace)::testMatrix(const M44f, M44f (*)(const M44f &, Eulerf::Order), Eulerf::Order)"
                     );
      }
    }
    local_98 = local_98 + 1;
  } while( true );
}

Assistant:

void
testMatrix (
    const M44f M,
    M44f (*matrixEulerMatrix) (const M44f&, Eulerf::Order),
    Eulerf::Order order)
{
    //
    // Extract Euler angles from M, and convert the
    // Euler angles back to a matrix, N.
    //

    M44f N = matrixEulerMatrix (M, order);

    //
    // Verify that the entries in M and N do not
    // differ too much.
    //

    M44f D (M - N);

    for (int j = 0; j < 3; ++j)
    {
        for (int k = 0; k < 3; ++k)
        {
            if (abs (D[j][k]) > 0.000002)
            {
                cout << "unexpectedly large matrix to "
                        "euler angles conversion error: "
                     << D[j][k] << endl;

                cout << j << " " << k << endl;

                cout << "M\n" << M << endl;
                cout << "N\n" << N << endl;
                cout << "D\n" << D << endl;

                assert (false);
            }
        }
    }
}